

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Iterator<int,false,std::allocator<unsigned_long>>::
coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Iterator<int,false,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          it)

{
  ulong uVar1;
  value_type vVar2;
  bool bVar3;
  size_t sVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference puVar7;
  ulong local_28;
  size_t j;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_local;
  
  this_local = (Iterator<int,_false,_std::allocator<unsigned_long>_> *)it._M_current;
  marray_detail::Assert<bool>(*(long *)this != 0);
  uVar1 = *(ulong *)(this + 0x10);
  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::size
                    (*(View<int,_false,_std::allocator<unsigned_long>_> **)this);
  marray_detail::Assert<bool>(uVar1 < sVar4);
  bVar3 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple
                    (*(View<int,_false,_std::allocator<unsigned_long>_> **)this);
  if (bVar3) {
    View<int,false,std::allocator<unsigned_long>>::
    indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (*(View<int,false,std::allocator<unsigned_long>> **)this,*(size_t *)(this + 0x10),
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )this_local);
  }
  else {
    local_28 = 0;
    while (sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18)
                             ), local_28 < sVar5) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18),
                          local_28);
      vVar2 = *pvVar6;
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&this_local);
      *puVar7 = vVar2;
      local_28 = local_28 + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&this_local);
    }
  }
  return;
}

Assistant:

inline void
Iterator<T, isConst, A>::coordinate
(
    CoordinateIterator it
) const
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index_ < view_->size());
    if(view_->isSimple()) {
        view_->indexToCoordinates(index_, it);
    }
    else {
        for(std::size_t j=0; j<coordinates_.size(); ++j, ++it) {
            *it = coordinates_[j];
        }
    }
}